

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O0

bool __thiscall ON_ErrorLog::EnableLogging(ON_ErrorLog *this)

{
  uint uVar1;
  ON_ErrorLog *this_local;
  
  if (this == (ON_ErrorLog *)0x0) {
    this_local._7_1_ = false;
  }
  else if (this == ON_ACTIVE_ERROR_LOG) {
    this_local._7_1_ = true;
  }
  else if (ON_ACTIVE_ERROR_LOG == (ON_ErrorLog *)0x0) {
    uVar1 = Count(this);
    if (uVar1 < 0x20) {
      this_local._7_1_ = true;
      ON_ACTIVE_ERROR_LOG = this;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ErrorLog::EnableLogging()
{
  if ( 0 == ((ON__UINT_PTR)this) )
    return false;
  if (this == ON_ACTIVE_ERROR_LOG)
    return true;
  if (nullptr != ON_ACTIVE_ERROR_LOG)
    return false;
  if (Count() >= ON_ErrorLog::MaximumEventCount)
    return false;

  ON_ACTIVE_ERROR_LOG = this;
  return true;
}